

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

bool jessilib::equalsi<char16_t,char>
               (basic_string_view<char16_t,_std::char_traits<char16_t>_> lhs,
               basic_string_view<char,_std::char_traits<char>_> rhs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  jessilib *this;
  char16_t *pcVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  wchar32 wVar9;
  decode_result dVar10;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  
  pcVar5 = lhs._M_str;
  sVar6 = lhs._M_len;
  pcVar7 = rhs._M_str;
  this = (jessilib *)rhs._M_len;
  do {
    if ((sVar6 == 0) || (this == (jessilib *)0x0)) {
      return sVar6 == 0 && this == (jessilib *)0x0;
    }
    wVar9 = (wchar32)(ushort)*pcVar5;
    lVar8 = 1;
    if (((sVar6 != 1) && ((wVar9 & 0xfc00U) == 0xd800)) && (((ushort)pcVar5[1] & 0xfc00) == 0xdc00))
    {
      wVar9 = (uint)(ushort)*pcVar5 * 0x400 + (uint)(ushort)pcVar5[1] + L'\xfca02400';
      lVar8 = 2;
    }
    in_string._M_str = (char *)this;
    in_string._M_len = (size_t)pcVar7;
    dVar10 = decode_codepoint_utf8<char>(this,in_string);
    sVar4 = dVar10.units;
    if (sVar4 == 0) {
LAB_00233dc0:
      bVar1 = false;
    }
    else {
      if (wVar9 != dVar10.codepoint) {
        iVar2 = jessilib::fold(wVar9);
        iVar3 = jessilib::fold(dVar10.codepoint);
        if (iVar2 != iVar3) goto LAB_00233dc0;
      }
      pcVar5 = pcVar5 + lVar8;
      sVar6 = sVar6 - lVar8;
      pcVar7 = pcVar7 + sVar4;
      this = this + -sVar4;
      bVar1 = true;
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}